

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_context.c
# Opt level: O1

context context_create(char *name)

{
  context __ptr;
  size_t sVar1;
  char *__dest;
  scope psVar2;
  context pcVar3;
  
  if (name != (char *)0x0) {
    __ptr = (context)malloc(0x10);
    pcVar3 = __ptr;
    if (__ptr != (context)0x0) {
      sVar1 = strlen(name);
      __dest = (char *)malloc(sVar1 + 1);
      __ptr->name = __dest;
      if (__dest == (char *)0x0) {
        free(__ptr);
        pcVar3 = (context)0x0;
      }
      else {
        memcpy(__dest,name,sVar1 + 1);
        psVar2 = scope_create("global_namespace");
        __ptr->sp = psVar2;
      }
    }
    if (__ptr != (context)0x0) {
      return pcVar3;
    }
  }
  return (context)0x0;
}

Assistant:

context context_create(const char *name)
{
	if (name != NULL)
	{
		context ctx = malloc(sizeof(struct context_type));

		if (ctx != NULL)
		{
			size_t name_size = strlen(name) + 1;

			ctx->name = malloc(sizeof(char) * name_size);

			if (ctx->name == NULL)
			{
				/* error */

				free(ctx);

				return NULL;
			}

			memcpy(ctx->name, name, name_size);

			ctx->sp = scope_create("global_namespace");

			return ctx;
		}
	}

	return NULL;
}